

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void merge_colors(uint16_t *colors,uint16_t *cached_colors,int n_colors,int n_cached_colors)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (0 < n_colors && n_cached_colors != 0) {
    uVar4 = 0;
    iVar5 = 0;
    iVar6 = n_cached_colors;
    do {
      if ((iVar5 < n_cached_colors) &&
         ((n_colors <= iVar6 || (cached_colors[iVar5] <= colors[iVar6])))) {
        puVar3 = cached_colors;
        iVar1 = iVar6;
        iVar2 = iVar5 + 1;
        iVar7 = iVar5;
      }
      else {
        puVar3 = colors;
        iVar1 = iVar6 + 1;
        iVar2 = iVar5;
        iVar7 = iVar6;
      }
      iVar5 = iVar2;
      iVar6 = iVar1;
      colors[uVar4] = puVar3[iVar7];
      uVar4 = uVar4 + 1;
    } while ((uint)n_colors != uVar4);
  }
  return;
}

Assistant:

static void merge_colors(uint16_t *colors, uint16_t *cached_colors,
                         int n_colors, int n_cached_colors) {
  if (n_cached_colors == 0) return;
  int cache_idx = 0, trans_idx = n_cached_colors;
  for (int i = 0; i < n_colors; ++i) {
    if (cache_idx < n_cached_colors &&
        (trans_idx >= n_colors ||
         cached_colors[cache_idx] <= colors[trans_idx])) {
      colors[i] = cached_colors[cache_idx++];
    } else {
      assert(trans_idx < n_colors);
      colors[i] = colors[trans_idx++];
    }
  }
}